

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source-amiga.cc
# Opt level: O2

PSpriteAmiga __thiscall
DataSourceAmiga::decode_amiga_sprite
          (DataSourceAmiga *this,PBuffer *data,size_t width,size_t height,uint8_t *palette)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  long lVar2;
  byte bVar3;
  uint uVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  _func_int *p_Var6;
  size_t sVar7;
  byte *pbVar8;
  long in_R9;
  size_t i;
  size_t sVar9;
  PSpriteAmiga PVar10;
  unsigned_long local_40;
  size_t height_local;
  
  local_40 = height * 8;
  height_local = (size_t)palette;
  std::make_shared<DataSourceAmiga::SpriteAmiga,unsigned_long,unsigned_long&>
            ((unsigned_long *)this,&local_40);
  p_Var6 = (this->super_DataSourceLegacy).super_DataSourceBase.super_Source._vptr_Source[7];
  _Var5._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(*(long *)width + 0x18);
  pbVar8 = (byte *)((long)&(*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                             (*(long *)width + 0x18))->_vptr__Sp_counted_base +
                   height * height_local * 2);
  for (sVar7 = 0; sVar7 != height_local; sVar7 = sVar7 + 1) {
    sVar9 = 0;
    while( true ) {
      p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&(_Var5._M_pi)->_vptr__Sp_counted_base + height);
      if (sVar9 == height) break;
      for (uVar4 = 7; -1 < (int)uVar4; uVar4 = uVar4 - 1) {
        bVar3 = (byte)uVar4;
        lVar2 = (ulong)((uint)((*(byte *)&(_Var5._M_pi)->_vptr__Sp_counted_base >> (uVar4 & 0x1f) &
                               1) != 0) +
                        (*(byte *)&p_Var1->_vptr__Sp_counted_base >> (bVar3 & 0x1f) & 1) * 2 +
                        (*pbVar8 >> (bVar3 & 0x1f) & 1) * 4 +
                       (pbVar8[height] >> (bVar3 & 0x1f) & 1) * 8) * 3;
        p_Var6[2] = *(code *)(in_R9 + 0x30 + lVar2);
        p_Var6[1] = *(code *)(in_R9 + 0x31 + lVar2);
        *p_Var6 = (_func_int)*(undefined1 *)(in_R9 + 0x32 + lVar2);
        p_Var6[3] = (code)0xff;
        p_Var6 = p_Var6 + 4;
      }
      _Var5._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    ((long)&(_Var5._M_pi)->_vptr__Sp_counted_base + 1);
      pbVar8 = pbVar8 + 1;
      sVar9 = sVar9 + 1;
    }
    _Var5._M_pi = p_Var1;
    pbVar8 = pbVar8 + height;
  }
  PVar10.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var5._M_pi;
  PVar10.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (PSpriteAmiga)
         PVar10.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

DataSourceAmiga::PSpriteAmiga
DataSourceAmiga::decode_amiga_sprite(PBuffer data, size_t width, size_t height,
                                     uint8_t *palette) {
  PSpriteAmiga sprite = std::make_shared<SpriteAmiga>(width*8, height);

  uint8_t *src_1 = reinterpret_cast<uint8_t*>(data->get_data());
  size_t bp2s = width * 2 * height;
  uint8_t *src_2 = src_1 + bp2s;
  Data::Sprite::Color *res = sprite->get_writable_data();

  for (size_t y = 0; y < height; y++) {
    for (size_t i = 0; i < width; i++) {
      for (int k = 7; k >= 0; k--) {
        uint8_t color = 0;
        color |= (((*src_1) >> k) & 0x01) << 0;
        color |= (((*(src_1 + width)) >> k) & 0x01) << 1;
        color |= (((*src_2) >> k) & 0x01) << 2;
        color |= (((*(src_2 + width)) >> k) & 0x01) << 3;
        color |= 0x10;
        res->red = palette[color*3+0];    // R
        res->green = palette[color*3+1];  // G
        res->blue = palette[color*3+2];   // B
        res->alpha = 0xFF;                // A
        res++;
      }
      src_1++;
      src_2++;
    }
    src_1 += width;
    src_2 += width;
  }

  return sprite;
}